

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magicBoxTest.cc
# Opt level: O1

void __thiscall example_add_Test::TestBody(example_add_Test *this)

{
  bool bVar1;
  char *message;
  MagicBox mb;
  AssertionResult gtest_ar;
  char *in_stack_ffffffffffffffc8;
  char *in_stack_ffffffffffffffd0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  AssertHelper in_stack_ffffffffffffffe0;
  char in_stack_ffffffffffffffe8;
  undefined7 in_stack_ffffffffffffffe9;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffff0;
  
  MagicBox::smash((MagicBox *)&stack0xffffffffffffffd7,5.0,3);
  testing::internal::DoubleNearPredFormat
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,(char *)0x11a20a,
             (double)in_stack_fffffffffffffff0.ptr_,
             (double)CONCAT71(in_stack_ffffffffffffffe9,in_stack_ffffffffffffffe8),
             (double)in_stack_ffffffffffffffe0.data_);
  if (in_stack_ffffffffffffffe8 == '\0') {
    testing::Message::Message((Message *)&local_28);
    if (in_stack_fffffffffffffff0.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((in_stack_fffffffffffffff0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xffffffffffffffe0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jdalt[P]nan-plus-unit-tests/test_native/magicBoxTest.cc"
               ,9,message);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&stack0xffffffffffffffe0,(Message *)&local_28);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xffffffffffffffe0);
    if (local_28.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_28.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_28.ptr_ + 8))();
      }
      local_28.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&stack0xfffffffffffffff0,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

TEST(example, add)
{
    double res;
    MagicBox mb;
    res = mb.smash(5.0, 3);
    ASSERT_NEAR(res, 15.0, 1.0e-11);
}